

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

void EMIT_OP_RPTR_NUM(CodeGenGenericContext *ctx,x86Command op,x86Size size,x86Reg index,
                     int multiplier,x86Reg base,uint shift,uint num)

{
  x86Argument arg_00;
  x86Argument arg_01;
  CodeGenGenericContext *pCVar1;
  x86Argument local_c8;
  undefined1 local_a8 [16];
  anon_union_8_6_73be8994_for_x86Argument_2 local_98;
  x86Reg local_90;
  x86Reg xStack_8c;
  x86Argument local_88;
  undefined1 local_68 [16];
  anon_union_8_6_73be8994_for_x86Argument_2 local_58;
  x86Reg local_50;
  x86Reg xStack_4c;
  undefined1 local_48 [8];
  x86Argument arg;
  uint local_20;
  x86Reg base_local;
  int multiplier_local;
  x86Reg index_local;
  x86Size size_local;
  x86Command op_local;
  CodeGenGenericContext *ctx_local;
  
  arg.ptrNum = base;
  local_20 = multiplier;
  base_local = index;
  multiplier_local = size;
  index_local = op;
  _size_local = ctx;
  if ((ctx->skipTracking & 1U) == 0) {
    CodeGenGenericContext::RedirectAddressComputation
              (ctx,&base_local,(int *)&local_20,(x86Reg *)&arg.ptrNum,&shift);
    CodeGenGenericContext::ReadRegister(_size_local,arg.ptrNum);
    CodeGenGenericContext::ReadRegister(_size_local,base_local);
  }
  x86Argument::x86Argument
            ((x86Argument *)local_48,multiplier_local,base_local,local_20,arg.ptrNum,shift);
  switch(index_local) {
  case rEAX:
  case 0x4d:
    if ((_size_local->skipTracking & 1U) == 0) {
      if (arg.ptrNum == 5) {
        __assert_fail("base != rESP",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                      ,0x786,
                      "void EMIT_OP_RPTR_NUM(CodeGenGenericContext &, x86Command, x86Size, x86Reg, int, x86Reg, unsigned int, unsigned int)"
                     );
      }
      local_68._0_8_ = local_48;
      local_68._8_8_ = arg._0_8_;
      local_58 = arg.field_1;
      local_50 = arg.ptrBase;
      xStack_4c = arg.ptrIndex;
      arg_00.field_1 = (anon_union_8_6_73be8994_for_x86Argument_2)arg._0_8_;
      arg_00._0_8_ = local_48;
      arg_00.ptrBase = arg.field_1._0_4_;
      arg_00.ptrIndex = arg.field_1._4_4_;
      arg_00.ptrMult = arg.ptrBase;
      arg_00.ptrNum = arg.ptrIndex;
      CodeGenGenericContext::InvalidateAddressValue(_size_local,arg_00);
      CodeGenGenericContext::MemKillDeadStore(_size_local,(x86Argument *)local_48);
      pCVar1 = _size_local;
      x86Argument::x86Argument(&local_88,num);
      CodeGenGenericContext::MemWrite(pCVar1,(x86Argument *)local_48,&local_88);
    }
    break;
  default:
    __assert_fail("!\"unknown instruction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                  ,0x7ae,
                  "void EMIT_OP_RPTR_NUM(CodeGenGenericContext &, x86Command, x86Size, x86Reg, int, x86Reg, unsigned int, unsigned int)"
                 );
  case rR15|rR12:
  case rR15|rR13:
  case rR15|rR14:
  case 0x20:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x4f:
  case 0x50:
  case 0x53:
  case 0x54:
  case 0x56:
  case 0x57:
  case 0x58:
    if ((_size_local->skipTracking & 1U) == 0) {
      CodeGenGenericContext::MemRead(_size_local,(x86Argument *)local_48);
      local_a8._0_8_ = local_48;
      local_a8._8_8_ = arg._0_8_;
      local_98 = arg.field_1;
      local_90 = arg.ptrBase;
      xStack_8c = arg.ptrIndex;
      arg_01.field_1 = (anon_union_8_6_73be8994_for_x86Argument_2)arg._0_8_;
      arg_01._0_8_ = local_48;
      arg_01.ptrBase = arg.field_1._0_4_;
      arg_01.ptrIndex = arg.field_1._4_4_;
      arg_01.ptrMult = arg.ptrBase;
      arg_01.ptrNum = arg.ptrIndex;
      CodeGenGenericContext::InvalidateAddressValue(_size_local,arg_01);
      pCVar1 = _size_local;
      x86Argument::x86Argument(&local_c8);
      CodeGenGenericContext::MemWrite(pCVar1,(x86Argument *)local_48,&local_c8);
    }
    break;
  case 0x2a:
  case 0x59:
    CodeGenGenericContext::MemRead(_size_local,(x86Argument *)local_48);
  }
  _size_local->x86Op->name = index_local;
  (_size_local->x86Op->argA).type = argPtr;
  (_size_local->x86Op->argA).field_1.num = multiplier_local;
  (_size_local->x86Op->argA).ptrIndex = base_local;
  (_size_local->x86Op->argA).ptrMult = local_20;
  (_size_local->x86Op->argA).ptrBase = arg.ptrNum;
  (_size_local->x86Op->argA).ptrNum = shift;
  (_size_local->x86Op->argB).type = argNumber;
  (_size_local->x86Op->argB).field_1.labelID = num;
  _size_local->x86Op = _size_local->x86Op + 1;
  return;
}

Assistant:

void EMIT_OP_RPTR_NUM(CodeGenGenericContext &ctx, x86Command op, x86Size size, x86Reg index, int multiplier, x86Reg base, unsigned shift, unsigned num)
{
#ifdef NULLC_OPTIMIZE_X86
	if(!ctx.skipTracking)
	{
		ctx.RedirectAddressComputation(index, multiplier, base, shift);

		// Register reads
		ctx.ReadRegister(base);
		ctx.ReadRegister(index);
	}

	x86Argument arg = x86Argument(size, index, multiplier, base, shift);

	switch(op)
	{
	case o_mov:
	case o_mov64:
		if(ctx.skipTracking)
			break;

		assert(base != rESP);

		ctx.InvalidateAddressValue(arg);

		ctx.MemKillDeadStore(arg);

		// Track target memory value
		ctx.MemWrite(arg, x86Argument(num));
		break;
	case o_add:
	case o_sub:
	case o_adc:
	case o_sbb:
	case o_shl:
	case o_sal:
	case o_sar:
	case o_and:
	case o_or:
	case o_xor:
	case o_add64:
	case o_sub64:
	case o_sal64:
	case o_sar64:
	case o_and64:
	case o_or64:
	case o_xor64:
		if(ctx.skipTracking)
			break;

		ctx.MemRead(arg);

		ctx.InvalidateAddressValue(arg);

		ctx.MemWrite(arg, x86Argument());
		break;
	case o_cmp:
	case o_cmp64:
		ctx.MemRead(arg);
		break;
	default:
		assert(!"unknown instruction");
	}
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argPtr;
	ctx.x86Op->argA.ptrSize = size;
	ctx.x86Op->argA.ptrIndex = index;
	ctx.x86Op->argA.ptrMult = multiplier;
	ctx.x86Op->argA.ptrBase = base;
	ctx.x86Op->argA.ptrNum = shift;
	ctx.x86Op->argB.type = x86Argument::argNumber;
	ctx.x86Op->argB.num = num;
	ctx.x86Op++;
}